

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,
          vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>_> *out,char *param_2)

{
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  local_48;
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (out->
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ).
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (out->
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ).
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (out->
       super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ).
       super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (out->
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ).
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (out->
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ).
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (out->
  super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ).
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ::~vector(&local_28);
  ::std::
  vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

ElemBase()
    : dna_type(nullptr)
    {
        // empty
    }